

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O3

void TTD::NSSnapValues::EmitSnapContext(SnapContext *snapCtx,FileWriter *writer,Separator separator)

{
  TopLevelFunctionInContextRelation *pTVar1;
  undefined7 in_register_00000011;
  ulong uVar2;
  long lVar3;
  
  (*writer->_vptr_FileWriter[6])(writer,CONCAT71(in_register_00000011,separator) & 0xffffffff);
  FileWriter::WriteLogTag(writer,ctxTag,snapCtx->ScriptContextLogId,NoSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)snapCtx->IsPNRGSeeded,1);
  FileWriter::WriteUInt64(writer,u64Val,snapCtx->RandomSeed0,CommaSeparator);
  FileWriter::WriteUInt64(writer,u64Val,snapCtx->RandomSeed1,CommaSeparator);
  FileWriter::WriteString(writer,ctxUri,&snapCtx->ContextSRC,CommaSeparator);
  FileWriter::WriteLengthValue(writer,snapCtx->LoadedTopLevelScriptCount,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  if (snapCtx->LoadedTopLevelScriptCount != 0) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      pTVar1 = snapCtx->LoadedTopLevelScriptArray;
      (*writer->_vptr_FileWriter[6])(writer,(ulong)(lVar3 != 0));
      FileWriter::WriteUInt32
                (writer,bodyCounterId,*(uint32 *)((long)&pTVar1->TopLevelBodyCtr + lVar3),
                 NoSeparator);
      FileWriter::WriteAddr
                (writer,functionBodyId,
                 *(TTD_PTR_ID *)((long)&pTVar1->ContextSpecificBodyPtrId + lVar3),CommaSeparator);
      (*writer->_vptr_FileWriter[7])(writer,0);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < snapCtx->LoadedTopLevelScriptCount);
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  FileWriter::WriteLengthValue(writer,snapCtx->NewFunctionTopLevelScriptCount,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  if (snapCtx->NewFunctionTopLevelScriptCount != 0) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      pTVar1 = snapCtx->NewFunctionTopLevelScriptArray;
      (*writer->_vptr_FileWriter[6])(writer,(ulong)(lVar3 != 0));
      FileWriter::WriteUInt32
                (writer,bodyCounterId,*(uint32 *)((long)&pTVar1->TopLevelBodyCtr + lVar3),
                 NoSeparator);
      FileWriter::WriteAddr
                (writer,functionBodyId,
                 *(TTD_PTR_ID *)((long)&pTVar1->ContextSpecificBodyPtrId + lVar3),CommaSeparator);
      (*writer->_vptr_FileWriter[7])(writer,0);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < snapCtx->NewFunctionTopLevelScriptCount);
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  FileWriter::WriteLengthValue(writer,snapCtx->EvalTopLevelScriptCount,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  if (snapCtx->EvalTopLevelScriptCount != 0) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      pTVar1 = snapCtx->EvalTopLevelScriptArray;
      (*writer->_vptr_FileWriter[6])(writer,(ulong)(lVar3 != 0));
      FileWriter::WriteUInt32
                (writer,bodyCounterId,*(uint32 *)((long)&pTVar1->TopLevelBodyCtr + lVar3),
                 NoSeparator);
      FileWriter::WriteAddr
                (writer,functionBodyId,
                 *(TTD_PTR_ID *)((long)&pTVar1->ContextSpecificBodyPtrId + lVar3),CommaSeparator);
      (*writer->_vptr_FileWriter[7])(writer,0);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < snapCtx->EvalTopLevelScriptCount);
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  FileWriter::WriteLengthValue(writer,snapCtx->PendingAsyncModCount,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  if (snapCtx->PendingAsyncModCount != 0) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      (*writer->_vptr_FileWriter[6])(writer,(ulong)(lVar3 != 0));
      FileWriter::WriteLogTag
                (writer,logTag,
                 *(TTD_LOG_PTR_ID *)((long)&snapCtx->PendingAsyncModArray->LogId + lVar3),
                 NoSeparator);
      FileWriter::WriteUInt32
                (writer,u32Val,*(uint32 *)((long)&snapCtx->PendingAsyncModArray->Index + lVar3),
                 CommaSeparator);
      (*writer->_vptr_FileWriter[7])(writer,0);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < snapCtx->PendingAsyncModCount);
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  (*writer->_vptr_FileWriter[7])(writer,0);
  return;
}

Assistant:

void EmitSnapContext(const SnapContext* snapCtx, FileWriter* writer, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);

            writer->WriteLogTag(NSTokens::Key::ctxTag, snapCtx->ScriptContextLogId);
            writer->WriteBool(NSTokens::Key::boolVal, snapCtx->IsPNRGSeeded, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt64(NSTokens::Key::u64Val, snapCtx->RandomSeed0, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt64(NSTokens::Key::u64Val, snapCtx->RandomSeed1, NSTokens::Separator::CommaSeparator);
            writer->WriteString(NSTokens::Key::ctxUri, snapCtx->ContextSRC, NSTokens::Separator::CommaSeparator);

            writer->WriteLengthValue(snapCtx->LoadedTopLevelScriptCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < snapCtx->LoadedTopLevelScriptCount; ++i)
            {
                const TopLevelFunctionInContextRelation* cri = snapCtx->LoadedTopLevelScriptArray + i;
                NSTokens::Separator sep = (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator;

                writer->WriteRecordStart(sep);
                writer->WriteUInt32(NSTokens::Key::bodyCounterId, cri->TopLevelBodyCtr);
                writer->WriteAddr(NSTokens::Key::functionBodyId, cri->ContextSpecificBodyPtrId, NSTokens::Separator::CommaSeparator);
                writer->WriteRecordEnd();
            }
            writer->WriteSequenceEnd();

            writer->WriteLengthValue(snapCtx->NewFunctionTopLevelScriptCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < snapCtx->NewFunctionTopLevelScriptCount; ++i)
            {
                const TopLevelFunctionInContextRelation* cri = snapCtx->NewFunctionTopLevelScriptArray + i;
                NSTokens::Separator sep = (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator;

                writer->WriteRecordStart(sep);
                writer->WriteUInt32(NSTokens::Key::bodyCounterId, cri->TopLevelBodyCtr);
                writer->WriteAddr(NSTokens::Key::functionBodyId, cri->ContextSpecificBodyPtrId, NSTokens::Separator::CommaSeparator);
                writer->WriteRecordEnd();
            }
            writer->WriteSequenceEnd();

            writer->WriteLengthValue(snapCtx->EvalTopLevelScriptCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < snapCtx->EvalTopLevelScriptCount; ++i)
            {
                const TopLevelFunctionInContextRelation* cri = snapCtx->EvalTopLevelScriptArray + i;
                NSTokens::Separator sep = (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator;

                writer->WriteRecordStart(sep);
                writer->WriteUInt32(NSTokens::Key::bodyCounterId, cri->TopLevelBodyCtr);
                writer->WriteAddr(NSTokens::Key::functionBodyId, cri->ContextSpecificBodyPtrId, NSTokens::Separator::CommaSeparator);
                writer->WriteRecordEnd();
            }
            writer->WriteSequenceEnd();

            writer->WriteLengthValue(snapCtx->PendingAsyncModCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < snapCtx->PendingAsyncModCount; ++i)
            {
                NSTokens::Separator sep = (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator;
                writer->WriteRecordStart(sep);
                writer->WriteLogTag(NSTokens::Key::logTag, snapCtx->PendingAsyncModArray[i].LogId);
                writer->WriteUInt32(NSTokens::Key::u32Val, snapCtx->PendingAsyncModArray[i].Index, NSTokens::Separator::CommaSeparator);
                writer->WriteRecordEnd();
            }
            writer->WriteSequenceEnd();

            writer->WriteRecordEnd();
        }